

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

shared_ptr<kratos::Port> __thiscall
kratos::FunctionStmtBlock::input(FunctionStmtBlock *this,string *name,uint32_t width,bool is_signed)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_bool>
  pVar1;
  shared_ptr<kratos::Port> sVar2;
  uint local_34;
  PortDirection local_30;
  uint32_t width_local;
  PortType local_28;
  undefined1 local_22;
  bool local_21 [8];
  bool is_signed_local;
  
  local_34 = (uint)CONCAT71(in_register_00000009,is_signed);
  local_30 = In;
  width_local = 1;
  local_28 = Data;
  std::__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::Port>,kratos::Generator*&,kratos::PortDirection,std::__cxx11::string_const&,unsigned_int&,int,kratos::PortType,bool&>
            ((__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<kratos::Port> *)&local_22,(Generator **)(name + 7),&local_30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000014,width),&local_34,(int *)&width_local,&local_28,local_21);
  pVar1 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Port>>>>
                      *)&name[8]._M_string_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_register_00000014,width),(shared_ptr<kratos::Port> *)this);
  sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = pVar1._8_8_
  ;
  sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Port>)
         sVar2.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Port> FunctionStmtBlock::input(const std::string &name, uint32_t width,
                                               bool is_signed) {
    auto p = std::make_shared<Port>(parent_, PortDirection::In, name, width, 1, PortType::Data,
                                    is_signed);
    ports_.emplace(name, p);
    return p;
}